

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::eliminate_reshape_after_global_pooling(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar7 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    uVar8 = lVar7 >> 3;
    lVar7 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar7]->type);
      if ((iVar5 == 0) &&
         (pLVar2 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar7],
         *(int *)((long)&pLVar2[1].userdata + 4) != 0)) {
        uVar9 = lVar7 + 1;
        if (uVar9 < uVar8) {
          iVar5 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
            if (((iVar6 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar9],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 4)) && (*piVar4 == iVar5))
            goto LAB_00169e6e;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar8);
        }
        else {
LAB_00169e6e:
          if (((uVar9 != uVar8) &&
              (pLVar3 = (((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar9],
              *(int *)((long)&pLVar3[1]._vptr_Layer + 4) == -0xe9)) &&
             ((iVar5._0_1_ = pLVar3[1].support_bf16_storage,
              iVar5._1_1_ = pLVar3[1].support_fp16_storage,
              iVar5._2_1_ = pLVar3[1].support_int8_storage,
              iVar5._3_1_ = pLVar3[1].support_image_storage, iVar5 == -0xe9 &&
              (iVar6._0_1_ = pLVar3[1].support_tensor_storage,
              iVar6._1_1_ = pLVar3[1].support_reserved_00,
              iVar6._2_1_ = pLVar3[1].support_reserved_0, iVar6._3_1_ = pLVar3[1].support_reserved_1
              , iVar6 == 0)))) {
            fprintf(_stderr,"eliminate_reshape_after_global_pooling %s %s\n",
                    (pLVar2->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
            iVar5 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar5;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar5].producer = (int)lVar7;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x52219a);
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != uVar8 + (uVar8 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_reshape_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Reshape
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reshape")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[j];
        if (reshape->h != -233 || reshape->c != -233 || reshape->permute != 0)
            continue;

        fprintf(stderr, "eliminate_reshape_after_global_pooling %s %s\n", pooling->name.c_str(), reshape->name.c_str());

        int top_blob_index_final = reshape->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        reshape->type = "ncnnfused";
    }

    return 0;
}